

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationXX.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationXX<std::complex<float>_>::matrix(RotationXX<std::complex<float>_> *this)

{
  complex<float> m32;
  complex<float> m01;
  data_type extraout_RDX;
  complex<float> in_RSI;
  complex<float> in_R8;
  complex<float> in_R9;
  double in_XMM0_Qa;
  double dVar1;
  double __x;
  SquareMatrix<std::complex<float>_> SVar2;
  complex<float> m31;
  undefined4 in_stack_ffffffffffffff40;
  float __r;
  SquareMatrix<std::complex<float>_> *m33;
  complex<float> local_a0;
  complex<float> local_98;
  complex<float> local_90;
  complex<float> local_88;
  complex<float> local_80;
  complex<float> local_78;
  complex<float> local_70;
  complex<float> local_68;
  _ComplexT local_60;
  _ComplexT local_58;
  complex<float> local_50;
  _ComplexT local_48;
  complex<float> local_40;
  complex<float> local_38;
  _ComplexT local_30;
  complex<float> local_28;
  complex<float> o;
  complex<float> d;
  RotationXX<std::complex<float>_> *this_local;
  
  m31._M_value = in_RSI._M_value;
  m33 = (SquareMatrix<std::complex<float>_> *)this;
  dVar1 = QRotationGate2<std::complex<float>_>::cos
                    ((QRotationGate2<std::complex<float>_> *)in_RSI._M_value,in_XMM0_Qa);
  __r = 0.0;
  std::complex<float>::complex(&o,SUB84(dVar1,0),0.0);
  dVar1 = QRotationGate2<std::complex<float>_>::sin
                    ((QRotationGate2<std::complex<float>_> *)m31._M_value,__x);
  std::complex<float>::complex(&local_28,__r,-SUB84(dVar1,0));
  local_30 = o._M_value;
  std::complex<float>::complex(&local_38,__r,__r);
  std::complex<float>::complex(&local_40,__r,__r);
  local_48 = local_28._M_value;
  std::complex<float>::complex(&local_50,__r,__r);
  local_58 = o._M_value;
  local_60 = local_28._M_value;
  std::complex<float>::complex(&local_68,__r,__r);
  std::complex<float>::complex(&local_70,__r,__r);
  local_78._M_value = local_28._M_value;
  local_80._M_value = o._M_value;
  std::complex<float>::complex(&local_88,__r,__r);
  local_90._M_value = local_28._M_value;
  std::complex<float>::complex(&local_98,__r,__r);
  std::complex<float>::complex(&local_a0,__r,__r);
  m32._M_value._4_4_ = __r;
  m32._M_value._0_4_ = in_stack_ffffffffffffff40;
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (m33,in_RSI,m01,local_70,in_R8,in_R9,local_70,local_78,local_80,local_88,local_90,
             local_98,local_a0,o,m31,m32,(complex<float>)m33);
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,-this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d , o , 0 ,
                                                  0 , o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }